

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::matrix4d>
          (GeomPrimvar *this,matrix4d *dest,string *err)

{
  Attribute *this_00;
  bool bVar1;
  uint32_t tyid;
  value_type *pvVar2;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this_01;
  const_reference pvVar3;
  matrix4d *pmVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long lVar5;
  long lVar6;
  storage_t<tinyusdz::value::matrix4d> *psVar7;
  storage_t<tinyusdz::value::matrix4d> *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  byte bVar9;
  allocator local_185;
  undefined1 local_184 [4];
  string local_180;
  string local_160;
  optional<tinyusdz::value::matrix4d> local_140;
  optional<tinyusdz::value::matrix4d> pv;
  
  bVar9 = 0;
  if (dest != (matrix4d *)0x0) {
    this_00 = &this->_attr;
    bVar1 = Attribute::is_blocked(this_00);
    if (!bVar1) {
      bVar1 = primvar::PrimVar::has_value(&(this->_attr)._var);
      if (!bVar1) {
        if (*(pointer *)
             ((long)&(this->_attr)._var._ts._samples.
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ._M_impl.super__Vector_impl_data + 8) ==
            (this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          return (bool)'\0';
        }
        this_01 = tinyusdz::value::TimeSamples::get_samples(&(this->_attr)._var._ts);
        pvVar3 = std::
                 vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ::at(this_01,0);
        pmVar4 = tinyusdz::value::Value::as<tinyusdz::value::matrix4d>(&pvVar3->value,false);
        if (pmVar4 != (matrix4d *)0x0) {
          for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
            dest->m[0][0] = pmVar4->m[0][0];
            pmVar4 = (matrix4d *)((long)pmVar4 + ((ulong)bVar9 * -2 + 1) * 8);
            dest = (matrix4d *)((long)dest + ((ulong)bVar9 * -2 + 1) * 8);
          }
          return (bool)'\x01';
        }
        return (bool)'\0';
      }
      tyid = Attribute::type_id(this_00);
      bVar1 = IsSupportedGeomPrimvarType(tyid);
      if (!bVar1) {
        if (err == (string *)0x0) {
          return (bool)'\0';
        }
        std::__cxx11::string::string
                  ((string *)&local_140,"Unsupported type for GeomPrimvar. type = `{}`",
                   (allocator *)(local_184 + 4));
        Attribute::type_name_abi_cxx11_(&local_160,this_00);
        fmt::format<std::__cxx11::string>((string *)&pv,(fmt *)&local_140,&local_160,in_RCX);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return (bool)'\0';
      }
      Attribute::get_value<tinyusdz::value::matrix4d>(&local_140,this_00);
      pv.has_value_ = local_140.has_value_;
      if (local_140.has_value_ == true) {
        lVar6 = 0x10;
        psVar7 = &local_140.contained;
        psVar8 = &pv.contained;
        for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(undefined8 *)psVar8 = *(undefined8 *)psVar7;
          psVar7 = (storage_t<tinyusdz::value::matrix4d> *)
                   ((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
          psVar8 = (storage_t<tinyusdz::value::matrix4d> *)((long)psVar8 + (ulong)bVar9 * -0x10 + 8)
          ;
        }
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value(&pv);
        for (; lVar6 != 0; lVar6 = lVar6 + -1) {
          dest->m[0][0] = pvVar2->m[0][0];
          pvVar2 = (value_type *)((long)pvVar2 + ((ulong)bVar9 * -2 + 1) * 8);
          dest = (matrix4d *)((long)dest + ((ulong)bVar9 * -2 + 1) * 8);
        }
        return true;
      }
      if (err != (string *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_160,
                   "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`",
                   &local_185);
        local_184 = (undefined1  [4])0x38;
        Attribute::type_name_abi_cxx11_((string *)(local_184 + 4),this_00);
        fmt::format<unsigned_int,std::__cxx11::string>
                  ((string *)&local_140,(fmt *)&local_160,(string *)local_184,
                   (uint *)(local_184 + 4),in_R8);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return local_140.has_value_;
      }
      return local_140.has_value_;
    }
  }
  if (err != (string *)0x0) {
    std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}